

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void __thiscall r_exec::View::View(View *this,SysView *source,Code *object)

{
  uint64_t uVar1;
  
  r_code::View::View(&this->super_View,source,object);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_001c1618;
  (this->controller).object = (_Object *)0x0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_groupMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_groupMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  uVar1 = GetOID();
  *(int *)&(this->super_View).field_0x58 = (int)uVar1;
  reset(this);
  return;
}

Assistant:

View::View(r_code::SysView *source, r_code::Code *object): r_code::View(source, object), controller(nullptr)
{
    _code[VIEW_OID].atom = GetOID();
    reset();
}